

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# title.c
# Opt level: O3

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    handle = glfwCreateWindow(400,400,anon_var_dwarf_2f,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      iVar1 = glfwWindowShouldClose(handle);
      while (iVar1 == 0) {
        (*glad_glClear)(0x4000);
        glfwSwapBuffers(handle);
        glfwWaitEvents();
        iVar1 = glfwWindowShouldClose(handle);
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(400, 400, "English 日本語 русский язык 官話", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}